

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QString,_QVariant> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::findNode<QLatin1String>
          (Data<QHashPrivate::Node<QString,_QVariant>_> *this,QLatin1String *key)

{
  size_t hash;
  ulong uVar1;
  Node<QString,_QVariant> *pNVar2;
  Bucket BVar3;
  
  hash = qHash(*key,this->seed);
  BVar3 = findBucketWithHash<QLatin1String>(this,key,hash);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QString,_QVariant> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QVariant> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }